

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

char * scanf_fmtstr(char *src,char *type)

{
  int iVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char *in_RSI;
  char *in_RDI;
  bool bVar4;
  int ok;
  char *r;
  char i32 [6];
  char *_type;
  char tmp;
  int exp;
  char *end;
  char in_stack_ffffffffffffffaf;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  char *fmt;
  int in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  char local_2e [6];
  char *local_28;
  char local_1d;
  int local_1c;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_18 = in_RDI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    bVar4 = false;
    if (*local_18 != '\0') {
      ppuVar2 = __ctype_b_loc();
      bVar4 = false;
      if (((((*ppuVar2)[(int)*local_18] & 0x2000) == 0) && (bVar4 = false, *local_18 != ')')) &&
         (bVar4 = false, *local_18 != ']')) {
        iVar1 = strncmp(local_18,"...",3);
        bVar4 = iVar1 != 0;
      }
    }
    if (!bVar4) break;
    local_18 = local_18 + 1;
  }
  local_1c = (int)local_18 - (int)local_8;
  fmt = local_10;
  if (local_10 == (char *)0x0) {
    fmt = &local_1d;
  }
  builtin_strncpy(local_2e,"%*i%n",6);
  local_28 = fmt;
  pcVar3 = try_fmt(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,fmt,
                   (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffaf);
  if ((((pcVar3 == (char *)0x0) &&
       (pcVar3 = try_fmt((char *)0x0,in_stack_ffffffffffffffc4,fmt,
                         (char *)CONCAT17(1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffaf),
       pcVar3 == (char *)0x0)) &&
      ((pcVar3 = try_fmt((char *)0x0,in_stack_ffffffffffffffc4,fmt,
                         (char *)CONCAT17(1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffaf),
       pcVar3 == (char *)0x0 &&
       ((pcVar3 = try_fmt((char *)0x0,in_stack_ffffffffffffffc4,fmt,
                          (char *)CONCAT17(1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffaf),
        pcVar3 == (char *)0x0 &&
        (pcVar3 = try_fmt((char *)0x0,in_stack_ffffffffffffffc4,fmt,
                          (char *)CONCAT17(1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffaf),
        pcVar3 == (char *)0x0)))))) &&
     (pcVar3 = try_fmt((char *)0x0,in_stack_ffffffffffffffc4,fmt,
                       (char *)CONCAT17(1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffaf),
     pcVar3 == (char *)0x0)) {
    pcVar3 = try_fmt((char *)0x0,in_stack_ffffffffffffffc4,fmt,
                     (char *)CONCAT17(1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffaf);
  }
  if (pcVar3 == local_2e) {
    pcVar3 = "%*x%n";
  }
  return pcVar3;
}

Assistant:

static const char* scanf_fmtstr(const char* src, char* type)
{
    const char* end = src;
    // skip to string end, word end or a closing parenthesis
    for(; *end && !isspace(*end) && (*end != ')') && (*end != ']')
               && strncmp(end, "...", 3); ++end);

    int exp = end - src;

    // store type byte in the parameter, or in a temporary variable?
    char tmp;
    char* _type = type ? type : &tmp;

    const char i32[] = "%*"PRIi32"%n";

    const char* r; // result
    int ok = (r = try_fmt(src, exp, "%*"PRIi64"h%n", _type, 'h'))
          || (r = try_fmt(src, exp, "%*d%n", _type, 'i'))
          || (r = try_fmt(src, exp, "%*"PRIi32"i%n", _type, 'i'))
          || (r = try_fmt(src, exp, i32, _type, 'i'))
          || (r = try_fmt(src, exp, "%*lfd%n", _type, 'd'))
          || (r = try_fmt(src, exp, "%*ff%n", _type, 'f'))
          || (r = try_fmt(src, exp, "%*f%n", _type, 'f'));
    (void)ok;
    if(r == i32)
        r = "%*x%n";
    return r;
}